

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O0

QPen qPenFromStyle(QBrush *b,qreal width,BorderStyle s)

{
  int in_EDX;
  QPen *in_RSI;
  DataPtr in_RDI;
  QBrush *in_XMM0_Qa;
  PenStyle ps;
  undefined4 uVar1;
  
  uVar1 = 0;
  switch(in_EDX - 2) {
  case FlatCap:
    uVar1 = 3;
    break;
  case 1:
    uVar1 = 2;
    if ((double)in_XMM0_Qa == 1.0) {
      uVar1 = 3;
    }
    break;
  case 2:
  case 8:
  case 9:
    uVar1 = 1;
    break;
  default:
    break;
  case 4:
    uVar1 = 4;
    break;
  case 5:
    uVar1 = 5;
  }
  QPen::QPen(in_RSI,in_XMM0_Qa,(qreal)CONCAT44(in_EDX,uVar1),NoPen,in_EDX - 2,in_RDI.d.ptr._4_4_);
  return (DataPtr)(DataPtr)in_RDI.d.ptr;
}

Assistant:

static QPen qPenFromStyle(const QBrush& b, qreal width, BorderStyle s)
{
    Qt::PenStyle ps = Qt::NoPen;

    switch (s) {
    case BorderStyle_Dotted:
        ps  = Qt::DotLine;
        break;
    case BorderStyle_Dashed:
        ps = width == 1 ? Qt::DotLine : Qt::DashLine;
        break;
    case BorderStyle_DotDash:
        ps = Qt::DashDotLine;
        break;
    case BorderStyle_DotDotDash:
        ps = Qt::DashDotDotLine;
        break;
    case BorderStyle_Inset:
    case BorderStyle_Outset:
    case BorderStyle_Solid:
        ps = Qt::SolidLine;
        break;
    default:
        break;
    }

    return QPen(b, width, ps, Qt::FlatCap);
}